

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O0

void * customrecalloc(void *p,size_t num,size_t sz)

{
  void *__s;
  long in_RDX;
  long in_RSI;
  void *in_RDI;
  void *ptr;
  size_t n;
  
  __s = customrealloc(in_RDI,in_RSI * in_RDX);
  if (__s != (void *)0x0) {
    memset(__s,0,in_RSI * in_RDX);
  }
  return __s;
}

Assistant:

void * MYCDECL CUSTOM_RECALLOC (void * p, size_t num, size_t sz)
{
  auto n = num * sz;
  void * ptr = CUSTOM_REALLOC (p, n);
  if (ptr) {
    // Clear out the memory.
    memset (ptr, 0, n);
  }
  return ptr;
}